

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  pointer ppcVar1;
  cmGlobalGenerator *this_00;
  byte bVar2;
  TargetType TVar3;
  int iVar4;
  cmGlobalGenerator *pcVar5;
  pointer ppcVar6;
  ImportPropertyMap properties;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  ppcVar6 = (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar6 != ppcVar1) {
    do {
      this_00 = (cmGlobalGenerator *)*ppcVar6;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar5 = this_00;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
      if (TVar3 == OBJECT_LIBRARY) {
        pcVar5 = this->LG->GlobalGenerator;
        bVar2 = (*(code *)((cmTarget *)pcVar5->_vptr_cmGlobalGenerator)[0x25].impl._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>)(pcVar5,0);
        TVar3 = (uint)(bVar2 ^ 1) + (uint)(bVar2 ^ 1) * 2 + OBJECT_LIBRARY;
      }
      if (TVar3 != INTERFACE_LIBRARY) {
        SetImportLocationProperty
                  ((cmExportBuildFileGenerator *)pcVar5,config,suffix,(cmGeneratorTarget *)this_00,
                   (ImportPropertyMap *)&local_60);
      }
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
        if (TVar3 == OBJECT_LIBRARY) {
          pcVar5 = this->LG->GlobalGenerator;
          iVar4 = (*pcVar5->_vptr_cmGlobalGenerator[0x25])(pcVar5,0);
          bVar2 = (byte)iVar4 ^ 1;
          TVar3 = (uint)bVar2 + (uint)bVar2 * 2 + OBJECT_LIBRARY;
        }
        if (TVar3 != INTERFACE_LIBRARY) {
          cmExportFileGenerator::SetImportDetailProperties
                    (&this->super_cmExportFileGenerator,config,suffix,(cmGeneratorTarget *)this_00,
                     (ImportPropertyMap *)&local_60,missingTargets);
          cmExportFileGenerator::SetImportLinkInterface
                    (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,
                     (cmGeneratorTarget *)this_00,(ImportPropertyMap *)&local_60,missingTargets);
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                  (this,os,config,this_00,&local_60);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != ppcVar1);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  for (cmGeneratorTarget* target : this->Exports) {
    // Collect import properties for this target.
    ImportPropertyMap properties;

    if (this->GetExportTargetType(target) != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (this->GetExportTargetType(target) !=
          cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties,
                                        missingTargets);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties, missingTargets);
      }

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, target, properties);
    }
  }
}